

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picPageAnalyzer.cpp
# Opt level: O1

string * __thiscall
picPageAnalyzer::getLossyPicSourceURL_abi_cxx11_
          (string *__return_storage_ptr__,picPageAnalyzer *this)

{
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"img id=\"img\"","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"src=\"","");
  pageAnalyzer::getInfoFromContent
            (__return_storage_ptr__,&this->super_pageAnalyzer,&local_40,0,0x12,&local_60,'\"');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string picPageAnalyzer::getLossyPicSourceURL()
{
    return this->getInfoFromContent(std::string("img id=\"img\""), 0, GETMODE_PART, std::string("src=\""), '\"');
}